

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall
wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr
          (RefPtr<wabt::interp::Extern> *this,Store *store,Ref ref)

{
  Index IVar1;
  Object *extraout_RAX;
  Object *pOVar2;
  Ref local_20;
  
  pOVar2 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if ((((ulong)pOVar2 & 1) == 0) && (pOVar2->kind_ - DefinedFunc < 6)) {
    local_20.index = ref.index;
    IVar1 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar1;
    pOVar2 = (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pOVar2 & 1) == 0) {
      this->obj_ = (Extern *)pOVar2;
      this->store_ = store;
      return;
    }
  }
  else {
    if (ref.index == 0) {
      interp::RefPtr((interp *)0x0);
      pOVar2 = extraout_RAX;
    }
    if (((ulong)pOVar2 & 1) == 0) {
      interp::RefPtr((interp *)(long)(int)pOVar2->kind_);
    }
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe5,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}